

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  PyHeapTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  _object *p_Var4;
  char *pcVar5;
  size_t sVar6;
  PyObject *pPVar7;
  PyObject **ppPVar8;
  handle *this;
  PyTypeObject *pPVar9;
  PyHeapTypeObject *local_330;
  PyTypeObject *local_318;
  handle local_2b0;
  handle local_2a8;
  handle local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  handle local_210;
  PyHeapTypeObject *local_208;
  PyTypeObject *type;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  PyHeapTypeObject *local_1b0;
  PyHeapTypeObject *heap_type;
  PyTypeObject *metaclass;
  tuple_accessor local_198;
  PyTypeObject *local_178;
  PyObject *base;
  tuple bases;
  internals *internals;
  size_t size;
  char *tp_doc;
  object local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  char *local_e0;
  char *full_name;
  object local_b8;
  PyObject *local_b0;
  str_attr_accessor local_a8;
  object local_88;
  PyObject *local_80;
  handle local_78;
  object module_;
  handle local_50;
  object local_48;
  PyObject *local_40;
  handle local_28;
  object qualname;
  handle local_18;
  object name;
  type_record *rec_local;
  
  name.super_handle.m_ptr = (handle)(handle)rec;
  p_Var4 = (_object *)PyUnicode_FromString(rec->name);
  handle::handle<_object_*,_0>(&qualname.super_handle,p_Var4);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_18,qualname.super_handle.m_ptr);
  object::object((object *)&local_28,(object *)&local_18);
  bVar2 = handle::operator_cast_to_bool((handle *)name.super_handle.m_ptr);
  if (bVar2) {
    pPVar7 = handle::ptr((handle *)name.super_handle.m_ptr);
    iVar3 = _PyObject_TypeCheck(pPVar7,(PyTypeObject *)&PyModule_Type);
    if (iVar3 == 0) {
      local_40 = *(PyObject **)name.super_handle.m_ptr;
      bVar2 = hasattr((handle)local_40,"__qualname__");
      if (bVar2) {
        object_api<pybind11::handle>::attr
                  ((str_attr_accessor *)&module_,
                   (object_api<pybind11::handle> *)name.super_handle.m_ptr,"__qualname__");
        pPVar7 = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)&module_);
        ppPVar8 = handle::ptr(&local_18);
        p_Var4 = (_object *)PyUnicode_FromFormat("%U.%U",pPVar7,*ppPVar8);
        handle::handle<_object_*,_0>(&local_50,p_Var4);
        reinterpret_steal<pybind11::object>((pybind11 *)&local_48,local_50);
        object::operator=((object *)&local_28,&local_48);
        object::~object(&local_48);
        accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)&module_);
      }
    }
  }
  object::object((object *)&local_78);
  bVar2 = handle::operator_cast_to_bool((handle *)name.super_handle.m_ptr);
  if (bVar2) {
    local_80 = *(PyObject **)name.super_handle.m_ptr;
    bVar2 = hasattr((handle)local_80,"__module__");
    if (bVar2) {
      object_api<pybind11::handle>::attr
                (&local_a8,(object_api<pybind11::handle> *)name.super_handle.m_ptr,"__module__");
      accessor::operator_cast_to_object((accessor *)&local_88);
      object::operator=((object *)&local_78,&local_88);
      object::~object(&local_88);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a8);
    }
    else {
      local_b0 = *(PyObject **)name.super_handle.m_ptr;
      bVar2 = hasattr((handle)local_b0,"__name__");
      if (bVar2) {
        object_api<pybind11::handle>::attr
                  ((str_attr_accessor *)&full_name,
                   (object_api<pybind11::handle> *)name.super_handle.m_ptr,"__name__");
        accessor::operator_cast_to_object((accessor *)&local_b8);
        object::operator=((object *)&local_78,&local_b8);
        object::~object(&local_b8);
        accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)&full_name);
      }
    }
  }
  bVar2 = handle::operator_cast_to_bool(&local_78);
  tp_doc._7_1_ = 0;
  tp_doc._6_1_ = 0;
  tp_doc._5_1_ = 0;
  tp_doc._3_1_ = 0;
  if (bVar2) {
    str::str((str *)&local_148,(object *)&local_78);
    tp_doc._7_1_ = 1;
    object::cast<std::__cxx11::string>(&local_140,&local_148);
    tp_doc._6_1_ = 1;
    std::operator+(&local_120,&local_140,".");
    tp_doc._5_1_ = 1;
    std::operator+(&local_100,&local_120,*(char **)((long)name.super_handle.m_ptr + 8));
  }
  else {
    pcVar5 = *(char **)((long)name.super_handle.m_ptr + 8);
    std::allocator<char>::allocator();
    tp_doc._3_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,pcVar5,(allocator<char> *)((long)&tp_doc + 4));
  }
  pcVar5 = c_str<std::__cxx11::string>(&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  if ((tp_doc._3_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&tp_doc + 4));
  }
  if ((tp_doc._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_120);
  }
  if ((tp_doc._6_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  if ((tp_doc._7_1_ & 1) != 0) {
    str::~str((str *)&local_148);
  }
  size = 0;
  local_e0 = pcVar5;
  if ((*(long *)((long)name.super_handle.m_ptr + 0x50) != 0) &&
     (bVar2 = options::show_user_defined_docstrings(), bVar2)) {
    sVar6 = strlen(*(char **)((long)name.super_handle.m_ptr + 0x50));
    size = PyObject_Malloc(sVar6 + 1);
    memcpy((void *)size,*(void **)((long)name.super_handle.m_ptr + 0x50),sVar6 + 1);
  }
  bases.super_object.super_handle.m_ptr = (object)get_internals();
  tuple::tuple((tuple *)&base,(object *)((long)name.super_handle.m_ptr + 0x48));
  metaclass._7_1_ = 0;
  bVar2 = tuple::empty((tuple *)&base);
  if (bVar2) {
    local_318 = *(PyTypeObject **)((long)bases.super_object.super_handle.m_ptr + 0x1c0);
  }
  else {
    tuple::operator[](&local_198,(tuple *)&base,0);
    metaclass._7_1_ = 1;
    local_318 = (PyTypeObject *)
                accessor<pybind11::detail::accessor_policies::tuple_item>::ptr(&local_198);
  }
  if ((metaclass._7_1_ & 1) != 0) {
    accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor(&local_198);
  }
  local_178 = local_318;
  pPVar7 = handle::ptr((handle *)((long)name.super_handle.m_ptr + 0x58));
  if (pPVar7 == (PyObject *)0x0) {
    local_330 = *(PyHeapTypeObject **)((long)bases.super_object.super_handle.m_ptr + 0x1b8);
  }
  else {
    local_330 = (PyHeapTypeObject *)handle::ptr((handle *)((long)name.super_handle.m_ptr + 0x58));
  }
  heap_type = local_330;
  local_1b0 = (PyHeapTypeObject *)(*(local_330->ht_type).tp_alloc)(&local_330->ht_type,0);
  if (local_1b0 != (PyHeapTypeObject *)0x0) {
    type = (PyTypeObject *)object::release((object *)&local_18);
    ppPVar8 = handle::ptr((handle *)&type);
    local_1b0->ht_name = *ppPVar8;
    this = handle::inc_ref(&local_28);
    pPVar7 = handle::ptr(this);
    local_1b0->ht_qualname = pPVar7;
    local_208 = local_1b0;
    (local_1b0->ht_type).tp_name = local_e0;
    (local_1b0->ht_type).tp_doc = (char *)size;
    pPVar9 = type_incref(local_178);
    (local_208->ht_type).tp_base = pPVar9;
    (local_208->ht_type).tp_basicsize = 0x38;
    bVar2 = tuple::empty((tuple *)&base);
    if (!bVar2) {
      local_210 = object::release((object *)&base);
      ppPVar8 = handle::ptr(&local_210);
      (local_208->ht_type).tp_bases = *ppPVar8;
    }
    (local_208->ht_type).tp_init = pybind11_object_init;
    (local_208->ht_type).tp_as_number = &local_1b0->as_number;
    (local_208->ht_type).tp_as_sequence = &local_1b0->as_sequence;
    (local_208->ht_type).tp_as_mapping = &local_1b0->as_mapping;
    (local_208->ht_type).tp_as_async = &local_1b0->as_async;
    (local_208->ht_type).tp_flags = (local_208->ht_type).tp_flags | 0x200;
    if ((*(byte *)((long)name.super_handle.m_ptr + 0x80) >> 5 & 1) == 0) {
      (local_208->ht_type).tp_flags = (local_208->ht_type).tp_flags | 0x400;
    }
    if ((*(byte *)((long)name.super_handle.m_ptr + 0x80) >> 1 & 1) != 0) {
      enable_dynamic_attributes(local_1b0);
    }
    if ((*(byte *)((long)name.super_handle.m_ptr + 0x80) >> 2 & 1) != 0) {
      enable_buffer_protocol(local_1b0);
    }
    bVar2 = std::function::operator_cast_to_bool((function *)((long)name.super_handle.m_ptr + 0x60))
    ;
    if (bVar2) {
      std::function<void_(_heaptypeobject_*)>::operator()
                ((function<void_(_heaptypeobject_*)> *)((long)name.super_handle.m_ptr + 0x60),
                 local_1b0);
    }
    iVar3 = PyType_Ready(local_208);
    if (-1 < iVar3) {
      bVar2 = true;
      if ((*(byte *)((long)name.super_handle.m_ptr + 0x80) >> 1 & 1) != 0) {
        iVar3 = PyType_HasFeature(&local_208->ht_type,0x4000);
        bVar2 = iVar3 != 0;
      }
      if (bVar2) {
        bVar2 = handle::operator_cast_to_bool((handle *)name.super_handle.m_ptr);
        if (bVar2) {
          local_2a0.m_ptr = *name.super_handle.m_ptr;
          pcVar5 = *(char **)((long)name.super_handle.m_ptr + 8);
          handle::handle<_object_*,_0>(&local_2a8,(_object *)local_208);
          setattr(local_2a0,pcVar5,local_2a8);
        }
        else {
          _Py_INCREF((PyObject *)local_208);
        }
        bVar2 = handle::operator_cast_to_bool(&local_78);
        if (bVar2) {
          handle::handle<_object_*,_0>(&local_2b0,(_object *)local_208);
          setattr(local_2b0,"__module__",local_78);
        }
        pPVar1 = local_208;
        tuple::~tuple((tuple *)&base);
        object::~object((object *)&local_78);
        object::~object((object *)&local_28);
        object::~object((object *)&local_18);
        return (PyObject *)pPVar1;
      }
      __assert_fail("!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/class.h"
                    ,0x2df,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
    }
    pcVar5 = *(char **)((long)name.super_handle.m_ptr + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar5,&local_271);
    std::operator+(&local_250,&local_270,": PyType_Ready failed: ");
    error_string_abi_cxx11_();
    std::operator+(&local_230,&local_250,&local_298);
    pybind11_fail(&local_230);
  }
  pcVar5 = *(char **)((long)name.super_handle.m_ptr + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar5,&local_1f1);
  std::operator+(&local_1d0,&local_1f0,": Unable to create type object!");
  pybind11_fail(&local_1d0);
}

Assistant:

inline PyObject *make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }

    object module_;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__")) {
            module_ = rec.scope.attr("__module__");
        } else if (hasattr(rec.scope, "__name__")) {
            module_ = rec.scope.attr("__name__");
        }
    }

    const auto *full_name = c_str(
#if !defined(PYPY_VERSION)
        module_ ? str(module_).cast<std::string>() + "." + rec.name :
#endif
                rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (Python will free this later on) */
        size_t size = std::strlen(rec.doc) + 1;
#if PY_VERSION_HEX >= 0x030D0000
        tp_doc = (char *) PyMem_MALLOC(size);
#else
        tp_doc = (char *) PyObject_MALLOC(size);
#endif
        std::memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto *base = (bases.empty()) ? internals.instance_base : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *metaclass
        = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr() : internals.default_metaclass;

    auto *heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type) {
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");
    }

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *) base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (!bases.empty()) {
        type->tp_bases = bases.release().ptr();
    }

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
    type->tp_as_async = &heap_type->as_async;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE;
    if (!rec.is_final) {
        type->tp_flags |= Py_TPFLAGS_BASETYPE;
    }

    if (rec.dynamic_attr) {
        enable_dynamic_attributes(heap_type);
    }

    if (rec.buffer_protocol) {
        enable_buffer_protocol(heap_type);
    }

    if (rec.custom_type_setup_callback) {
        rec.custom_type_setup_callback(heap_type);
    }

    if (PyType_Ready(type) < 0) {
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed: " + error_string());
    }

    assert(!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope) {
        setattr(rec.scope, rec.name, (PyObject *) type);
    } else {
        Py_INCREF(type); // Keep it alive forever (reference leak)
    }

    if (module_) { // Needed by pydoc
        setattr((PyObject *) type, "__module__", module_);
    }

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}